

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O1

char * json::load<obj_array_var1>(char *in,size_t len,obj_array_var1 *t,int options)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  obj_array_var1 *poVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  property *__i;
  property *ppVar12;
  size_t sVar13;
  property *ppVar14;
  char *pcVar15;
  char *pcVar16;
  size_t sVar17;
  property *ppVar18;
  ulong uVar19;
  property *ppVar20;
  ulong uVar21;
  ulong uVar22;
  property *__last;
  bool bVar23;
  size_t props_size;
  LoadObject serializer;
  prop_map props;
  size_t local_2608;
  int local_25fc;
  LoadObject local_25f8;
  obj_array_var1 *local_25c0;
  property local_25b8;
  property local_2598 [14];
  char *local_23d8;
  size_t asStack_23d0 [3];
  property local_23b8 [284];
  
  local_2608 = 0;
  cVar10 = *in;
  pcVar15 = in;
  while ((cVar10 != '\0' && (iVar11 = isspace((int)cVar10), iVar11 != 0))) {
    cVar10 = pcVar15[1];
    pcVar15 = pcVar15 + 1;
  }
  if (*pcVar15 == '{') {
    pcVar15 = load_props(pcVar15 + 1,in + len,(prop_map *)&local_25b8,&local_2608);
    sVar13 = local_2608;
    if (*pcVar15 == '}') {
      local_25fc = options;
      local_25c0 = t;
      if (local_2608 != 0) {
        __last = &local_25b8 + local_2608;
        lVar3 = 0x3f;
        if (local_2608 != 0) {
          for (; local_2608 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<json::property*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(json::property_const&,json::property_const&)>>
                  (&local_25b8,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_json::property_&,_const_json::property_&)>)
                   0x14cd1b);
        if ((long)sVar13 < 0x11) {
          if (sVar13 != 1) {
            ppVar12 = local_2598;
            ppVar20 = &local_25b8;
            do {
              ppVar18 = ppVar12;
              uVar2 = (ppVar18->param).len;
              sVar13 = local_25b8.param.len;
              if (uVar2 < local_25b8.param.len) {
                sVar13 = uVar2;
              }
              if (sVar13 != 0) {
                uVar21 = 0;
                do {
                  cVar10 = ppVar20[1].param.str[uVar21];
                  cVar1 = *(char *)((long)&(((property *)local_25b8.param.str)->param).str + uVar21)
                  ;
                  if (cVar1 != cVar10) {
                    bVar23 = cVar10 < cVar1;
                    goto LAB_00153ff3;
                  }
                  uVar21 = uVar21 + 1;
                } while (sVar13 != uVar21);
              }
              bVar23 = uVar2 < local_25b8.param.len;
LAB_00153ff3:
              if (bVar23) {
                local_25f8.props = (prop_map *)(ppVar18->param).str;
                local_25f8.props_size = (ppVar18->param).len;
                local_25f8.current = (size_t)(ppVar18->value).str;
                local_25f8._24_8_ = (ppVar18->value).len;
                sVar17 = (long)ppVar18 - (long)&local_25b8;
                memmove((void *)((long)ppVar20 + (0x40 - sVar17)),&local_25b8,sVar17);
                local_25b8.param.str = (char *)local_25f8.props;
                local_25b8.param.len = local_25f8.props_size;
                local_25b8.value.str = (char *)local_25f8.current;
                local_25b8.value.len = local_25f8._24_8_;
              }
              else {
                pcVar16 = ppVar20[1].param.str;
                local_25f8.props = (prop_map *)(ppVar18->value).str;
                local_25f8.props_size = (ppVar18->value).len;
                uVar21 = (ppVar20->param).len;
                uVar19 = uVar21;
                if (uVar2 < uVar21) {
                  uVar19 = uVar2;
                }
                if (uVar19 != 0) {
                  uVar22 = 0;
                  do {
                    cVar10 = (ppVar20->param).str[uVar22];
                    if (cVar10 != pcVar16[uVar22]) {
                      bVar23 = pcVar16[uVar22] < cVar10;
                      goto LAB_00154081;
                    }
                    uVar22 = uVar22 + 1;
                  } while (uVar19 != uVar22);
                }
                bVar23 = uVar2 < uVar21;
LAB_00154081:
                ppVar12 = ppVar18;
                ppVar14 = ppVar18;
                if (bVar23) {
                  do {
                    ppVar12 = ppVar20;
                    pcVar4 = (ppVar12->param).str;
                    sVar13 = (ppVar12->param).len;
                    sVar5 = (ppVar12->value).len;
                    (ppVar14->value).str = (ppVar12->value).str;
                    (ppVar14->value).len = sVar5;
                    (ppVar14->param).str = pcVar4;
                    (ppVar14->param).len = sVar13;
                    uVar21 = ppVar12[-1].param.len;
                    uVar19 = uVar21;
                    if (uVar2 < uVar21) {
                      uVar19 = uVar2;
                    }
                    if (uVar19 != 0) {
                      uVar22 = 0;
                      do {
                        cVar10 = ppVar12[-1].param.str[uVar22];
                        if (cVar10 != pcVar16[uVar22]) {
                          bVar23 = pcVar16[uVar22] < cVar10;
                          goto LAB_001540df;
                        }
                        uVar22 = uVar22 + 1;
                      } while (uVar19 != uVar22);
                    }
                    bVar23 = uVar2 < uVar21;
LAB_001540df:
                    ppVar14 = ppVar12;
                    ppVar20 = ppVar12 + -1;
                  } while (bVar23);
                }
                (ppVar12->param).str = pcVar16;
                (ppVar12->param).len = uVar2;
                (ppVar12->value).str = (char *)local_25f8.props;
                (ppVar12->value).len = local_25f8.props_size;
              }
              ppVar12 = ppVar18 + 1;
              ppVar20 = ppVar18;
            } while (ppVar18 + 1 != __last);
          }
        }
        else {
          sVar17 = 0x20;
          ppVar12 = &local_25b8;
          do {
            ppVar20 = (property *)((long)&local_25b8.param.str + sVar17);
            uVar2 = *(ulong *)((long)local_2598 + (sVar17 - 0x18));
            sVar13 = local_25b8.param.len;
            if (uVar2 < local_25b8.param.len) {
              sVar13 = uVar2;
            }
            if (sVar13 != 0) {
              uVar21 = 0;
              do {
                cVar10 = (ppVar20->param).str[uVar21];
                cVar1 = *(char *)((long)&(((property *)local_25b8.param.str)->param).str + uVar21);
                if (cVar1 != cVar10) {
                  bVar23 = cVar10 < cVar1;
                  goto LAB_00153d93;
                }
                uVar21 = uVar21 + 1;
              } while (sVar13 != uVar21);
            }
            bVar23 = uVar2 < local_25b8.param.len;
LAB_00153d93:
            if (bVar23) {
              local_25f8.props = (prop_map *)(ppVar20->param).str;
              local_25f8.props_size = *(size_t *)((long)local_2598 + (sVar17 - 0x18));
              local_25f8.current = *(undefined8 *)((long)local_2598 + (sVar17 - 0x10));
              local_25f8._24_8_ = *(size_t *)((long)local_2598 + (sVar17 - 8));
              memmove(local_2598,&local_25b8,sVar17);
              local_25b8.param.str = (char *)local_25f8.props;
              local_25b8.param.len = local_25f8.props_size;
              local_25b8.value.str = (char *)local_25f8.current;
              local_25b8.value.len = local_25f8._24_8_;
            }
            else {
              pcVar16 = (ppVar20->param).str;
              local_25f8.props = *(prop_map **)((long)local_2598 + (sVar17 - 0x10));
              local_25f8.props_size = *(size_t *)((long)local_2598 + (sVar17 - 8));
              uVar21 = (ppVar12->param).len;
              uVar19 = uVar21;
              if (uVar2 < uVar21) {
                uVar19 = uVar2;
              }
              if (uVar19 != 0) {
                uVar22 = 0;
                do {
                  cVar10 = (ppVar12->param).str[uVar22];
                  if (cVar10 != pcVar16[uVar22]) {
                    bVar23 = pcVar16[uVar22] < cVar10;
                    goto LAB_00153e1d;
                  }
                  uVar22 = uVar22 + 1;
                } while (uVar19 != uVar22);
              }
              bVar23 = uVar2 < uVar21;
LAB_00153e1d:
              ppVar18 = ppVar20;
              ppVar14 = ppVar20;
              if (bVar23) {
                do {
                  ppVar18 = ppVar12;
                  pcVar4 = (ppVar18->param).str;
                  sVar13 = (ppVar18->param).len;
                  sVar5 = (ppVar18->value).len;
                  (ppVar14->value).str = (ppVar18->value).str;
                  (ppVar14->value).len = sVar5;
                  (ppVar14->param).str = pcVar4;
                  (ppVar14->param).len = sVar13;
                  uVar21 = ppVar18[-1].param.len;
                  uVar19 = uVar21;
                  if (uVar2 < uVar21) {
                    uVar19 = uVar2;
                  }
                  if (uVar19 != 0) {
                    uVar22 = 0;
                    do {
                      cVar10 = ppVar18[-1].param.str[uVar22];
                      if (cVar10 != pcVar16[uVar22]) {
                        bVar23 = pcVar16[uVar22] < cVar10;
                        goto LAB_00153e7b;
                      }
                      uVar22 = uVar22 + 1;
                    } while (uVar19 != uVar22);
                  }
                  bVar23 = uVar2 < uVar21;
LAB_00153e7b:
                  ppVar12 = ppVar18 + -1;
                  ppVar14 = ppVar18;
                } while (bVar23);
              }
              (ppVar18->param).str = pcVar16;
              (ppVar18->param).len = uVar2;
              (ppVar18->value).str = (char *)local_25f8.props;
              (ppVar18->value).len = local_25f8.props_size;
            }
            sVar17 = sVar17 + 0x20;
            ppVar12 = ppVar20;
          } while (sVar17 != 0x200);
          ppVar12 = local_23b8;
          do {
            pcVar16 = (ppVar12->param).str;
            uVar2 = (ppVar12->param).len;
            pcVar4 = (ppVar12->value).str;
            sVar13 = (ppVar12->value).len;
            uVar21 = ppVar12[-1].param.len;
            uVar19 = uVar21;
            if (uVar2 < uVar21) {
              uVar19 = uVar2;
            }
            if (uVar19 != 0) {
              uVar22 = 0;
              do {
                cVar10 = ppVar12[-1].param.str[uVar22];
                if (cVar10 != pcVar16[uVar22]) {
                  bVar23 = pcVar16[uVar22] < cVar10;
                  goto LAB_00153efb;
                }
                uVar22 = uVar22 + 1;
              } while (uVar19 != uVar22);
            }
            bVar23 = uVar2 < uVar21;
LAB_00153efb:
            ppVar20 = ppVar12 + -1;
            ppVar18 = ppVar12;
            ppVar14 = ppVar12;
            if (bVar23) {
              do {
                ppVar18 = ppVar20;
                pcVar6 = (ppVar18->param).str;
                sVar5 = (ppVar18->param).len;
                sVar7 = (ppVar18->value).len;
                (ppVar14->value).str = (ppVar18->value).str;
                (ppVar14->value).len = sVar7;
                (ppVar14->param).str = pcVar6;
                (ppVar14->param).len = sVar5;
                uVar21 = ppVar18[-1].param.len;
                uVar19 = uVar21;
                if (uVar2 < uVar21) {
                  uVar19 = uVar2;
                }
                if (uVar19 != 0) {
                  uVar22 = 0;
                  do {
                    cVar10 = ppVar18[-1].param.str[uVar22];
                    if (cVar10 != pcVar16[uVar22]) {
                      bVar23 = pcVar16[uVar22] < cVar10;
                      goto LAB_00153f5b;
                    }
                    uVar22 = uVar22 + 1;
                  } while (uVar19 != uVar22);
                }
                bVar23 = uVar2 < uVar21;
LAB_00153f5b:
                ppVar20 = ppVar18 + -1;
                ppVar14 = ppVar18;
              } while (bVar23);
            }
            (ppVar18->param).str = pcVar16;
            (ppVar18->param).len = uVar2;
            (ppVar18->value).str = pcVar4;
            (ppVar18->value).len = sVar13;
            ppVar12 = ppVar12 + 1;
          } while (ppVar12 != __last);
        }
      }
      poVar8 = local_25c0;
      local_25f8.props = (prop_map *)&local_25b8;
      local_25f8.props_size = local_2608;
      local_25f8.current = 0;
      local_25f8.options = local_25fc;
      local_25f8.error_pos = (char *)0x0;
      local_25f8._prev_name = "";
      local_25f8.start = in;
      bVar23 = LoadObject::process<int>(&local_25f8,"val1",&local_25c0->val1);
      bVar9 = LoadObject::process<float>(&local_25f8,"val2",&poVar8->val2);
      if (!bVar23) {
        return local_25f8.error_pos;
      }
      if (!bVar9) {
        return local_25f8.error_pos;
      }
      if (local_25f8.current < local_25f8.props_size) {
        return (&local_25b8)[local_25f8.current].param.str;
      }
      cVar10 = pcVar15[1];
      while( true ) {
        pcVar16 = pcVar15 + 1;
        if (cVar10 == '\0') {
          return pcVar16;
        }
        iVar11 = isspace((int)cVar10);
        if (iVar11 == 0) break;
        cVar10 = pcVar15[2];
        pcVar15 = pcVar16;
      }
      return pcVar16;
    }
  }
  return pcVar15 + -1;
}

Assistant:

const char* load(const char* in, size_t len, V& t, int options) {
	const char* start = in;
	prop_map props;
	size_t props_size = 0;
	in = skip_ws(in);

	if (*in != '{')
		return in - 1;										 // error
	in = load_props(in + 1, start + len, props, props_size); // load prop map for child object
	if (*in != '}')
		return in - 1; // error

	std::sort(props, props + props_size, compare_props);

	LoadObject serializer(props, props_size, start, options);
	if (!serialize(serializer, t))
		return serializer.error_pos;

	if (serializer.current < serializer.props_size)
		return props[serializer.current].param.str;

	in = skip_ws(in + 1); // skip whitespace after
	return in;
}